

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZChunkVector.h
# Opt level: O1

void __thiscall
TPZChunkVector<TPZGraphNode,_10>::~TPZChunkVector(TPZChunkVector<TPZGraphNode,_10> *this,void **vtt)

{
  long lVar1;
  TPZGraphNode *pTVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)*vtt;
  lVar1 = (this->fVec).super_TPZVec<TPZGraphNode_*>.fNElements;
  if (0 < lVar1) {
    lVar4 = 0;
    do {
      pTVar2 = (this->fVec).super_TPZVec<TPZGraphNode_*>.fStore[lVar4];
      if (pTVar2 != (TPZGraphNode *)0x0) {
        lVar3 = pTVar2[-1].fSequenceNumber;
        if (lVar3 != 0) {
          lVar5 = lVar3 * 0x30;
          do {
            TPZGraphNode::~TPZGraphNode
                      ((TPZGraphNode *)((long)&pTVar2[-1].super_TPZSavable._vptr_TPZSavable + lVar5)
                      );
            lVar5 = lVar5 + -0x30;
          } while (lVar5 != 0);
        }
        operator_delete__(&pTVar2[-1].fSequenceNumber,lVar3 * 0x30 + 8);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != lVar1);
  }
  TPZManVector<TPZGraphNode_*,_10>::~TPZManVector(&this->fVec);
  return;
}

Assistant:

TPZChunkVector<T, EXP>::~TPZChunkVector() {
    int64_t nchunks = fVec.NElements();

    for (int64_t i = 0; i < nchunks; i++) {
        if (fVec[i]) delete[] fVec[i];
    }
}